

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

String * __thiscall
Jinx::Impl::Parser::ParseMultiName_abi_cxx11_
          (String *__return_storage_ptr__,Parser *this,
          initializer_list<Jinx::Impl::SymbolType> symbols)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar1;
  SymbolType SVar2;
  SymbolType SVar3;
  pointer pSVar4;
  pointer pcVar5;
  Symbol *pSVar6;
  Symbol *pSVar7;
  byte bVar8;
  size_type sVar9;
  long lVar10;
  bool bVar11;
  
  sVar9 = symbols._M_len;
  if ((this->m_error == false) &&
     (pSVar4 = (this->m_currentSymbol)._M_current,
     pSVar4 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    paVar1 = &__return_storage_ptr__->field_2;
    if (pSVar4->type == NameValue) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      pcVar5 = (pSVar4->text)._M_dataplus._M_p;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                          __return_storage_ptr__,pcVar5,pcVar5 + (pSVar4->text)._M_string_length);
      bVar8 = 0;
      do {
        pSVar6 = (this->m_currentSymbol)._M_current;
        this->m_lastLine = pSVar6->lineNumber;
        pSVar7 = pSVar6 + 1;
        (this->m_currentSymbol)._M_current = pSVar7;
        if (this->m_error != false) {
          return __return_storage_ptr__;
        }
        if ((this->m_symbolList->
            super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
            super__Vector_impl_data._M_finish == pSVar7) {
          return __return_storage_ptr__;
        }
        if (pSVar7->type == NewLine) {
          return __return_storage_ptr__;
        }
        if (pSVar6[1].text._M_string_length == 0) {
          return __return_storage_ptr__;
        }
        SVar2 = pSVar7->type;
        if (SVar2 != NameValue) {
          bVar11 = sVar9 == 0;
          if ((sVar9 != 0) &&
             (SVar3 = *symbols._M_array, bVar8 = SVar2 == SVar3 | bVar8, SVar2 != SVar3)) {
            lVar10 = 4;
            do {
              bVar11 = sVar9 * 4 - lVar10 == 0;
              if (bVar11) break;
              SVar3 = *(SymbolType *)((long)symbols._M_array + lVar10);
              bVar8 = bVar8 | SVar2 == SVar3;
              lVar10 = lVar10 + 4;
            } while (SVar2 != SVar3);
          }
          if (!bVar11) {
            if ((bool)(bVar8 | (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                                *)(__return_storage_ptr__->_M_dataplus)._M_p == paVar1)) {
              return __return_storage_ptr__;
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_destroy(__return_storage_ptr__,
                       (__return_storage_ptr__->field_2)._M_allocated_capacity);
            return __return_storage_ptr__;
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                  (__return_storage_ptr__," ");
        pSVar7 = (this->m_currentSymbol)._M_current;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_append
                  (__return_storage_ptr__,(pSVar7->text)._M_dataplus._M_p,
                   (pSVar7->text)._M_string_length);
      } while( true );
    }
    Error<>(this,"Unexpected symbol type when parsing name");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::ParseMultiName(std::initializer_list<SymbolType> symbols)
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->type != SymbolType::NameValue)
		{
			Error("Unexpected symbol type when parsing name");
			return String();
		}
		String s = String(m_currentSymbol->text);
		NextSymbol();

		while (IsSymbolValid(m_currentSymbol) && !m_currentSymbol->text.empty())
		{
			if (m_currentSymbol->type != SymbolType::NameValue)
			{
				for (auto symbol : symbols)
				{
					if (m_currentSymbol->type == symbol)
						return s;
				}
			}
			s += " ";
			s += m_currentSymbol->text;
			NextSymbol();
		}

		return s;
	}